

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Desc::reSize(Desc *this,int rowDim,int colDim)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Status *pSVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar10;
  int iVar11;
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  iVar11 = (this->rowstat).thesize;
  iVar1 = (this->colstat).thesize;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::reSize(&this->rowstat,rowDim);
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  ::reSize(&this->colstat,colDim);
  auVar4 = _DAT_005f4040;
  auVar3 = _DAT_005f4030;
  auVar2 = _DAT_005f4020;
  if (iVar11 < rowDim) {
    lVar6 = (long)rowDim;
    lVar8 = (lVar6 - iVar11) + -1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    pSVar5 = (this->rowstat).data + lVar6 + -1;
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_005f4040;
    do {
      auVar12._8_4_ = (int)uVar7;
      auVar12._0_8_ = uVar7;
      auVar12._12_4_ = (int)(uVar7 >> 0x20);
      auVar14 = (auVar12 | auVar3) ^ auVar4;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ || iVar10 < auVar14._4_4_
                  ) & 1)) {
        *pSVar5 = D_UNDEFINED;
      }
      if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
          auVar14._12_4_ <= auVar9._12_4_) {
        pSVar5[-1] = D_UNDEFINED;
      }
      auVar12 = (auVar12 | auVar2) ^ auVar4;
      iVar15 = auVar12._4_4_;
      if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar12._0_4_ <= auVar9._0_4_)) {
        pSVar5[-2] = D_UNDEFINED;
        pSVar5[-3] = D_UNDEFINED;
      }
      uVar7 = uVar7 + 4;
      pSVar5 = pSVar5 + -4;
    } while (((lVar6 - iVar11) + 3U & 0xfffffffffffffffc) != uVar7);
  }
  auVar4 = _DAT_005f4040;
  auVar3 = _DAT_005f4030;
  auVar2 = _DAT_005f4020;
  if (iVar1 < colDim) {
    lVar6 = (long)colDim;
    lVar8 = (lVar6 - iVar1) + -1;
    auVar14._8_4_ = (int)lVar8;
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
    pSVar5 = (this->colstat).data + lVar6 + -1;
    uVar7 = 0;
    auVar14 = auVar14 ^ _DAT_005f4040;
    do {
      auVar13._8_4_ = (int)uVar7;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = (int)(uVar7 >> 0x20);
      auVar9 = (auVar13 | auVar3) ^ auVar4;
      iVar11 = auVar14._4_4_;
      if ((bool)(~(auVar9._4_4_ == iVar11 && auVar14._0_4_ < auVar9._0_4_ || iVar11 < auVar9._4_4_)
                & 1)) {
        *pSVar5 = D_UNDEFINED;
      }
      if ((auVar9._12_4_ != auVar14._12_4_ || auVar9._8_4_ <= auVar14._8_4_) &&
          auVar9._12_4_ <= auVar14._12_4_) {
        pSVar5[-1] = D_UNDEFINED;
      }
      auVar9 = (auVar13 | auVar2) ^ auVar4;
      iVar10 = auVar9._4_4_;
      if (iVar10 <= iVar11 && (iVar10 != iVar11 || auVar9._0_4_ <= auVar14._0_4_)) {
        pSVar5[-2] = D_UNDEFINED;
        pSVar5[-3] = D_UNDEFINED;
      }
      uVar7 = uVar7 + 4;
      pSVar5 = pSVar5 + -4;
    } while (((lVar6 - iVar1) + 3U & 0xfffffffffffffffc) != uVar7);
  }
  return;
}

Assistant:

void SPxBasisBase<R>::Desc::reSize(int rowDim, int colDim)
{

   assert(rowDim >= 0);
   assert(colDim >= 0);

   int noldrows = rowstat.size();
   int noldcols = colstat.size();

   rowstat.reSize(rowDim);
   colstat.reSize(colDim);

   for(int i = rowDim - 1; i >= noldrows; i--)
      rowstat[i] = D_UNDEFINED;

   for(int i = colDim - 1; i >= noldcols; i--)
      colstat[i] = D_UNDEFINED;
}